

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O1

vector<float,_std::allocator<float>_> * __thiscall
vkt::sr::anon_unknown_0::TextureGather2DArrayInstance::computeQuadTexCoord
          (vector<float,_std::allocator<float>_> *__return_storage_ptr__,
          TextureGather2DArrayInstance *this,int iterationNdx)

{
  int iVar1;
  pointer pfVar2;
  float fVar3;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = (this->m_iterations).
          super__Vector_base<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs,_std::allocator<vkt::sr::(anonymous_namespace)::Gather2DArrayArgs>_>
          ._M_impl.super__Vector_impl_data._M_start[iterationNdx].layerNdx;
  std::vector<float,_std::allocator<float>_>::resize(__return_storage_ptr__,0xc);
  pfVar2 = (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  fVar3 = (float)iVar1;
  pfVar2[0] = -0.3;
  pfVar2[1] = -0.4;
  pfVar2[2] = fVar3;
  pfVar2[3] = -0.3;
  pfVar2[4] = 1.6;
  pfVar2[5] = fVar3;
  pfVar2[6] = 1.5;
  pfVar2[7] = -0.4;
  pfVar2[8] = fVar3;
  pfVar2[9] = 1.5;
  pfVar2[10] = 1.6;
  pfVar2[0xb] = fVar3;
  return __return_storage_ptr__;
}

Assistant:

vector<float> TextureGather2DArrayInstance::computeQuadTexCoord (int iterationNdx) const
{
	vector<float> res;
	TextureTestUtil::computeQuadTexCoord2DArray(res, m_iterations[iterationNdx].layerNdx, Vec2(-0.3f, -0.4f), Vec2(1.5f, 1.6f));
	return res;
}